

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O0

bool libtorrent::aux::string_begins_no_case(char *s1,char *s2)

{
  char cVar1;
  char cVar2;
  char *local_20;
  char *s2_local;
  char *s1_local;
  
  local_20 = s2;
  s2_local = s1;
  while( true ) {
    if (*s2_local == '\0') {
      return true;
    }
    cVar1 = to_lower(*s2_local);
    cVar2 = to_lower(*local_20);
    if (cVar1 != cVar2) break;
    s2_local = s2_local + 1;
    local_20 = local_20 + 1;
  }
  return false;
}

Assistant:

bool string_begins_no_case(char const* s1, char const* s2)
	{
		TORRENT_ASSERT(s1 != nullptr);
		TORRENT_ASSERT(s2 != nullptr);

		while (*s1 != 0)
		{
			if (to_lower(*s1) != to_lower(*s2)) return false;
			++s1;
			++s2;
		}
		return true;
	}